

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.cpp
# Opt level: O3

void __thiscall mir::inst::OpAccInst::display(OpAccInst *this,ostream *o)

{
  (**(this->super_Inst).dest.super_Displayable._vptr_Displayable)(&(this->super_Inst).dest);
  std::__ostream_insert<char,std::char_traits<char>>(o," = ",3);
  display_op(o,this->op);
  std::__ostream_insert<char,std::char_traits<char>>(o," ",1);
  (**(this->lhs).super_Displayable._vptr_Displayable)(&this->lhs,o);
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  (**(this->rhs).super_Displayable._vptr_Displayable)(&this->rhs,o);
  std::__ostream_insert<char,std::char_traits<char>>(o,", ",2);
  (**(this->acc).super_Displayable._vptr_Displayable)(&this->acc,o);
  return;
}

Assistant:

void OpAccInst::display(std::ostream& o) const {
  o << dest << " = ";
  display_op(o, op);
  o << " " << lhs << ", " << rhs << ", " << acc;
}